

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_suite.cpp
# Opt level: O0

void map_suite::run(void)

{
  from_map_int_int();
  to_map_int_int();
  from_map_string_int();
  to_map_string_int();
  from_map_string_string();
  to_map_string_string();
  from_map_string_wstring();
  to_map_string_wstring();
  from_map_string_u16string();
  to_map_string_u16string();
  from_map_string_u32string();
  to_map_string_u32string();
  to_map_string_variable();
  fail_to_map_mixed();
  return;
}

Assistant:

void run()
{
    from_map_int_int();
    to_map_int_int();
    from_map_string_int();
    to_map_string_int();
    from_map_string_string();
    to_map_string_string();
    from_map_string_wstring();
    to_map_string_wstring();
    from_map_string_u16string();
    to_map_string_u16string();
    from_map_string_u32string();
    to_map_string_u32string();

    to_map_string_variable();

    fail_to_map_mixed();
}